

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

idx_t __thiscall
duckdb::RowGroup::GetCommittedSelVector
          (RowGroup *this,transaction_t start_time,transaction_t transaction_id,idx_t vector_idx,
          SelectionVector *sel_vector,idx_t max_count)

{
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_38;
  
  local_38 = GetVersionInfo(this);
  if (local_38.ptr != (RowVersionManager *)0x0) {
    optional_ptr<duckdb::RowVersionManager,_true>::CheckValid(&local_38);
    max_count = RowVersionManager::GetCommittedSelVector
                          (local_38.ptr,start_time,transaction_id,vector_idx,sel_vector,max_count);
  }
  return max_count;
}

Assistant:

idx_t RowGroup::GetCommittedSelVector(transaction_t start_time, transaction_t transaction_id, idx_t vector_idx,
                                      SelectionVector &sel_vector, idx_t max_count) {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return max_count;
	}
	return vinfo->GetCommittedSelVector(start_time, transaction_id, vector_idx, sel_vector, max_count);
}